

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O2

void __thiscall DIS::ArealObjectStatePdu::marshal(ArealObjectStatePdu *this,DataStream *dataStream)

{
  double *pdVar1;
  pointer pVVar2;
  ulong uVar3;
  long lVar4;
  Vector3Double x;
  
  SyntheticEnvironmentFamilyPdu::marshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::marshal(&this->_objectID,dataStream);
  EntityID::marshal(&this->_referencedObjectID,dataStream);
  DataStream::operator<<(dataStream,this->_updateNumber);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<(dataStream,this->_modifications);
  EntityType::marshal(&this->_objectType,dataStream);
  SixByteChunk::marshal(&this->_objectAppearance,dataStream);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_objectLocation).
                              super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_objectLocation).
                             super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5));
  SimulationAddress::marshal(&this->_requesterID,dataStream);
  SimulationAddress::marshal(&this->_receivingID,dataStream);
  lVar4 = 8;
  for (uVar3 = 0;
      pVVar2 = (this->_objectLocation).
               super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_objectLocation).
                            super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5);
      uVar3 = uVar3 + 1) {
    x._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001b2778;
    x._z = *(double *)((long)&pVVar2->_y + lVar4);
    pdVar1 = (double *)((long)&pVVar2->_vptr_Vector3Double + lVar4);
    x._x = *pdVar1;
    x._y = pdVar1[1];
    Vector3Double::marshal(&x,dataStream);
    Vector3Double::~Vector3Double(&x);
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

void ArealObjectStatePdu::marshal(DataStream& dataStream) const
{
    SyntheticEnvironmentFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _objectID.marshal(dataStream);
    _referencedObjectID.marshal(dataStream);
    dataStream << _updateNumber;
    dataStream << _forceID;
    dataStream << _modifications;
    _objectType.marshal(dataStream);
    _objectAppearance.marshal(dataStream);
    dataStream << ( unsigned short )_objectLocation.size();
    _requesterID.marshal(dataStream);
    _receivingID.marshal(dataStream);

     for(size_t idx = 0; idx < _objectLocation.size(); idx++)
     {
        Vector3Double x = _objectLocation[idx];
        x.marshal(dataStream);
     }

}